

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O2

Comparison __thiscall
wasm::anon_unknown_0::
RecGroupComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:320:29)>
::compare(RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:320:29)>
          *this,HeapType a,HeapType b)

{
  key_type __args_1;
  HeapType __args;
  iterator iVar1;
  iterator iVar2;
  bool bVar3;
  bool bVar4;
  key_type local_30;
  HeapType a_local;
  HeapType b_local;
  
  if (a.id < 0x7d == b.id < 0x7d) {
    if (a.id < 0x7d) {
      if (a.id == b.id) {
        return EQ;
      }
      return GT - (a.id < b.id);
    }
    local_30.id = a.id;
    a_local = b;
    iVar1 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,&local_30);
    iVar2 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->indicesB)._M_h,&a_local);
    __args = a_local;
    __args_1.id = local_30.id;
    if ((iVar1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur
        != (__node_type *)0x0) ==
        (iVar2.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur
        != (__node_type *)0x0)) {
      if (iVar1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
          _M_cur == (__node_type *)0x0) {
        bVar3 = std::function<bool_(wasm::HeapType,_wasm::HeapType)>::operator()
                          (&((this->compareTypes).a)->less,(HeapType)local_30.id,a_local);
        if (bVar3) {
          return LT;
        }
        bVar3 = std::function<bool_(wasm::HeapType,_wasm::HeapType)>::operator()
                          (&((this->compareTypes).a)->less,__args,(HeapType)__args_1.id);
        return (uint)bVar3 * 2;
      }
      if (*(uint *)((long)iVar1.
                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                          ._M_cur + 0x10) ==
          *(uint *)((long)iVar2.
                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                          ._M_cur + 0x10)) {
        return EQ;
      }
      return GT - (*(uint *)((long)iVar1.
                                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                   ._M_cur + 0x10) <
                  *(uint *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                  ._M_cur + 0x10));
    }
    bVar3 = iVar2.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
            _M_cur == (__node_type *)0x0;
    bVar4 = iVar1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
            _M_cur != (__node_type *)0x0;
  }
  else {
    bVar3 = 0x7c < b.id;
    bVar4 = a.id < 0x7d;
  }
  return GT - (byte)(bVar4 & bVar3);
}

Assistant:

Comparison compare(HeapType a, HeapType b) {
    if (a.isBasic() != b.isBasic()) {
      return b.isBasic() < a.isBasic() ? LT : GT;
    }
    if (a.isBasic()) {
      if (a.getID() != b.getID()) {
        return a.getID() < b.getID() ? LT : GT;
      }
      return EQ;
    }
    auto itA = indicesA.find(a);
    auto itB = indicesB.find(b);
    bool foundA = itA != indicesA.end();
    bool foundB = itB != indicesB.end();
    if (foundA != foundB) {
      return foundB < foundA ? LT : GT;
    }
    if (foundA) {
      auto indexA = itA->second;
      auto indexB = itB->second;
      if (indexA != indexB) {
        return indexA < indexB ? LT : GT;
      }
      return EQ;
    }
    // These types are external to the group, so fall back to the provided
    // comparator.
    return compareTypes(a, b);
  }